

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O1

string * __thiscall
anon_unknown.dwarf_11b384d::cmMacProjectDirectoryListGenerator::TransformNameBeforeCmp
          (string *__return_storage_ptr__,cmMacProjectDirectoryListGenerator *this,string *name)

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  size_t local_18;
  char *pcStack_10;
  
  local_28._M_str = (name->_M_dataplus)._M_p;
  local_28._M_len = name->_M_string_length;
  local_18 = (this->Extension)._M_len;
  pcStack_10 = (this->Extension)._M_str;
  views._M_len = 2;
  views._M_array = &local_28;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

std::string TransformNameBeforeCmp(std::string name) override
  {
    return cmStrCat(name, this->Extension);
  }